

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.cpp
# Opt level: O0

void __thiscall Kumu::XMLElement::DeleteAttrWithName(XMLElement *this,char *name)

{
  iterator __s;
  bool bVar1;
  __type _Var2;
  pointer __lhs;
  iterator local_70;
  const_iterator local_68 [3];
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Self local_28;
  _Self local_20;
  iterator i;
  char *name_local;
  XMLElement *this_local;
  
  i._M_node = (_List_node_base *)name;
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_xml.cpp"
                  ,0x14b,"void Kumu::XMLElement::DeleteAttrWithName(const char *)");
  }
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::begin(&this->m_AttrList);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::end(&this->m_AttrList);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    __lhs = std::_List_iterator<Kumu::NVPair>::operator->(&local_20);
    __s = i;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,(char *)__s._M_node,&local_49);
    _Var2 = std::operator==(&__lhs->name,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    if (_Var2) {
      local_70._M_node =
           (_List_node_base *)std::_List_iterator<Kumu::NVPair>::operator++(&local_20,0);
      std::_List_const_iterator<Kumu::NVPair>::_List_const_iterator(local_68,&local_70);
      std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::erase
                (&this->m_AttrList,local_68[0]);
    }
    else {
      std::_List_iterator<Kumu::NVPair>::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void
Kumu::XMLElement::DeleteAttrWithName(const char* name)
{
  assert(name);
  AttributeList::iterator i = m_AttrList.begin();

  while ( i != m_AttrList.end() )
    {
      if ( i->name == std::string(name) )
	m_AttrList.erase(i++);
      else
	++i;
    }
}